

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_setpoint.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionPosition_setpoint::ArchiveIN
          (ChFunctionPosition_setpoint *this,ChArchiveIn *marchive)

{
  eChSetpointMode_mapper mmapper;
  ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> local_c0;
  ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode> local_a0;
  ChNameValue<chrono::ChVector<double>_> local_80;
  ChNameValue<chrono::ChVector<double>_> local_68;
  ChNameValue<chrono::ChVector<double>_> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionPosition_setpoint>(marchive);
  ChFunctionPosition::ArchiveIN(&this->super_ChFunctionPosition,marchive);
  eChSetpointMode_mapper::eChSetpointMode_mapper((eChSetpointMode_mapper *)&local_a0);
  eChSetpointMode_mapper::operator()(&local_c0,(eChSetpointMode_mapper *)&local_a0,&this->mode);
  local_38._name = "mode";
  local_38._flags = '\0';
  local_38._value = &local_c0;
  ChArchiveIn::operator>>(marchive,&local_38);
  ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode>::~ChEnumMapper(&local_c0);
  local_50._value = &this->P;
  local_50._name = "P";
  local_50._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_50);
  local_68._value = &this->P_ds;
  local_68._name = "P_ds";
  local_68._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_68);
  local_80._value = &this->P_dsds;
  local_80._name = "P_dsds";
  local_80._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_80);
  ChEnumMapper<chrono::ChFunctionPosition_setpoint::eChSetpointMode>::~ChEnumMapper(&local_a0);
  return;
}

Assistant:

void ChFunctionPosition_setpoint::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionPosition_setpoint>();
	// deserialize parent class
    ChFunctionPosition::ArchiveIN(marchive);
    // deserialize all member data:
	eChSetpointMode_mapper mmapper;
	marchive >> CHNVP(mmapper(mode), "mode");
    marchive >> CHNVP(P);
	marchive >> CHNVP(P_ds);
	marchive >> CHNVP(P_dsds);
}